

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_ssse3.c
# Opt level: O3

void av1_build_compound_diffwtd_mask_highbd_ssse3
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,uint8_t *src0,int src0_stride,
               uint8_t *src1,int src1_stride,int h,int w,int bd)

{
  short *psVar1;
  short *psVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int j;
  ulong uVar6;
  short sVar7;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  short sVar19;
  ushort uVar20;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ushort uVar30;
  
  auVar23 = _DAT_00513a30;
  if (7 < w) {
    lVar3 = (long)src0 * 2;
    lVar4 = (long)src1 * 2;
    if (bd == 8) {
      if (mask_type == '\x01') {
        if (0 < h) {
          iVar5 = 0;
          do {
            uVar6 = 0;
            do {
              psVar1 = (short *)(lVar3 + uVar6 * 2);
              psVar2 = (short *)(lVar4 + uVar6 * 2);
              auVar8._0_2_ = *psVar1 - *psVar2;
              auVar8._2_2_ = psVar1[1] - psVar2[1];
              auVar8._4_2_ = psVar1[2] - psVar2[2];
              auVar8._6_2_ = psVar1[3] - psVar2[3];
              auVar8._8_2_ = psVar1[4] - psVar2[4];
              auVar8._10_2_ = psVar1[5] - psVar2[5];
              auVar8._12_2_ = psVar1[6] - psVar2[6];
              auVar8._14_2_ = psVar1[7] - psVar2[7];
              auVar9 = pabsw(auVar8,auVar8);
              auVar9 = psraw(auVar9,4);
              sVar7 = auVar9._0_2_;
              sVar13 = auVar9._2_2_;
              sVar14 = auVar9._4_2_;
              sVar15 = auVar9._6_2_;
              sVar16 = auVar9._8_2_;
              sVar17 = auVar9._10_2_;
              sVar18 = auVar9._12_2_;
              sVar19 = auVar9._14_2_;
              auVar10._0_2_ =
                   ((ushort)(sVar7 < -0x26) * -0x26 | (ushort)(sVar7 >= -0x26) * sVar7) + 0x26;
              auVar10._2_2_ =
                   ((ushort)(sVar13 < -0x26) * -0x26 | (ushort)(sVar13 >= -0x26) * sVar13) + 0x26;
              auVar10._4_2_ =
                   ((ushort)(sVar14 < -0x26) * -0x26 | (ushort)(sVar14 >= -0x26) * sVar14) + 0x26;
              auVar10._6_2_ =
                   ((ushort)(sVar15 < -0x26) * -0x26 | (ushort)(sVar15 >= -0x26) * sVar15) + 0x26;
              auVar10._8_2_ =
                   ((ushort)(sVar16 < -0x26) * -0x26 | (ushort)(sVar16 >= -0x26) * sVar16) + 0x26;
              auVar10._10_2_ =
                   ((ushort)(sVar17 < -0x26) * -0x26 | (ushort)(sVar17 >= -0x26) * sVar17) + 0x26;
              auVar10._12_2_ =
                   ((ushort)(sVar18 < -0x26) * -0x26 | (ushort)(sVar18 >= -0x26) * sVar18) + 0x26;
              auVar10._14_2_ =
                   ((ushort)(sVar19 < -0x26) * -0x26 | (ushort)(sVar19 >= -0x26) * sVar19) + 0x26;
              auVar9 = psubusw(auVar23,auVar10);
              sVar7 = auVar9._0_2_;
              sVar13 = auVar9._2_2_;
              sVar14 = auVar9._4_2_;
              sVar15 = auVar9._6_2_;
              sVar16 = auVar9._8_2_;
              sVar17 = auVar9._10_2_;
              sVar18 = auVar9._12_2_;
              sVar19 = auVar9._14_2_;
              *(ulong *)(mask + uVar6) =
                   CONCAT17((0 < sVar19) * (sVar19 < 0x100) * auVar9[0xe] - (0xff < sVar19),
                            CONCAT16((0 < sVar18) * (sVar18 < 0x100) * auVar9[0xc] - (0xff < sVar18)
                                     ,CONCAT15((0 < sVar17) * (sVar17 < 0x100) * auVar9[10] -
                                               (0xff < sVar17),
                                               CONCAT14((0 < sVar16) * (sVar16 < 0x100) * auVar9[8]
                                                        - (0xff < sVar16),
                                                        CONCAT13((0 < sVar15) * (sVar15 < 0x100) *
                                                                 auVar9[6] - (0xff < sVar15),
                                                                 CONCAT12((0 < sVar14) *
                                                                          (sVar14 < 0x100) *
                                                                          auVar9[4] -
                                                                          (0xff < sVar14),
                                                                          CONCAT11((0 < sVar13) *
                                                                                   (sVar13 < 0x100)
                                                                                   * auVar9[2] -
                                                                                   (0xff < sVar13),
                                                                                   (0 < sVar7) *
                                                                                   (sVar7 < 0x100) *
                                                                                   auVar9[0] -
                                                                                   (0xff < sVar7))))
                                                       ))));
              uVar6 = uVar6 + 8;
            } while (uVar6 < (uint)w);
            mask = mask + (uint)w;
            iVar5 = iVar5 + 1;
            lVar4 = lVar4 + (long)src1_stride * 2;
            lVar3 = lVar3 + (long)src0_stride * 2;
          } while (iVar5 != h);
        }
      }
      else if (0 < h) {
        iVar5 = 0;
        do {
          uVar6 = 0;
          do {
            psVar1 = (short *)(lVar3 + uVar6 * 2);
            psVar2 = (short *)(lVar4 + uVar6 * 2);
            auVar11._0_2_ = *psVar1 - *psVar2;
            auVar11._2_2_ = psVar1[1] - psVar2[1];
            auVar11._4_2_ = psVar1[2] - psVar2[2];
            auVar11._6_2_ = psVar1[3] - psVar2[3];
            auVar11._8_2_ = psVar1[4] - psVar2[4];
            auVar11._10_2_ = psVar1[5] - psVar2[5];
            auVar11._12_2_ = psVar1[6] - psVar2[6];
            auVar11._14_2_ = psVar1[7] - psVar2[7];
            auVar9 = pabsw(auVar11,auVar11);
            auVar9 = psraw(auVar9,4);
            sVar7 = auVar9._0_2_;
            sVar13 = auVar9._2_2_;
            sVar14 = auVar9._4_2_;
            sVar15 = auVar9._6_2_;
            sVar16 = auVar9._8_2_;
            sVar17 = auVar9._10_2_;
            sVar18 = auVar9._12_2_;
            sVar19 = auVar9._14_2_;
            auVar12._0_2_ =
                 ((ushort)(sVar7 < -0x26) * -0x26 | (ushort)(sVar7 >= -0x26) * sVar7) + 0x26;
            auVar12._2_2_ =
                 ((ushort)(sVar13 < -0x26) * -0x26 | (ushort)(sVar13 >= -0x26) * sVar13) + 0x26;
            auVar12._4_2_ =
                 ((ushort)(sVar14 < -0x26) * -0x26 | (ushort)(sVar14 >= -0x26) * sVar14) + 0x26;
            auVar12._6_2_ =
                 ((ushort)(sVar15 < -0x26) * -0x26 | (ushort)(sVar15 >= -0x26) * sVar15) + 0x26;
            auVar12._8_2_ =
                 ((ushort)(sVar16 < -0x26) * -0x26 | (ushort)(sVar16 >= -0x26) * sVar16) + 0x26;
            auVar12._10_2_ =
                 ((ushort)(sVar17 < -0x26) * -0x26 | (ushort)(sVar17 >= -0x26) * sVar17) + 0x26;
            auVar12._12_2_ =
                 ((ushort)(sVar18 < -0x26) * -0x26 | (ushort)(sVar18 >= -0x26) * sVar18) + 0x26;
            auVar12._14_2_ =
                 ((ushort)(sVar19 < -0x26) * -0x26 | (ushort)(sVar19 >= -0x26) * sVar19) + 0x26;
            auVar9 = psubusw(auVar12,auVar23);
            sVar7 = auVar12._0_2_ - auVar9._0_2_;
            sVar13 = auVar12._2_2_ - auVar9._2_2_;
            sVar14 = auVar12._4_2_ - auVar9._4_2_;
            sVar15 = auVar12._6_2_ - auVar9._6_2_;
            sVar16 = auVar12._8_2_ - auVar9._8_2_;
            sVar17 = auVar12._10_2_ - auVar9._10_2_;
            sVar18 = auVar12._12_2_ - auVar9._12_2_;
            sVar19 = auVar12._14_2_ - auVar9._14_2_;
            *(ulong *)(mask + uVar6) =
                 CONCAT17((0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19),
                          CONCAT16((0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18),
                                   CONCAT15((0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 -
                                            (0xff < sVar17),
                                            CONCAT14((0 < sVar16) * (sVar16 < 0x100) * (char)sVar16
                                                     - (0xff < sVar16),
                                                     CONCAT13((0 < sVar15) * (sVar15 < 0x100) *
                                                              (char)sVar15 - (0xff < sVar15),
                                                              CONCAT12((0 < sVar14) *
                                                                       (sVar14 < 0x100) *
                                                                       (char)sVar14 -
                                                                       (0xff < sVar14),
                                                                       CONCAT11((0 < sVar13) *
                                                                                (sVar13 < 0x100) *
                                                                                (char)sVar13 -
                                                                                (0xff < sVar13),
                                                                                (0 < sVar7) *
                                                                                (sVar7 < 0x100) *
                                                                                (char)sVar7 -
                                                                                (0xff < sVar7)))))))
                         );
            uVar6 = uVar6 + 8;
          } while (uVar6 < (uint)w);
          mask = mask + (uint)w;
          iVar5 = iVar5 + 1;
          lVar4 = lVar4 + (long)src1_stride * 2;
          lVar3 = lVar3 + (long)src0_stride * 2;
        } while (iVar5 != h);
      }
    }
    else {
      iVar5 = bd + -4;
      auVar9._0_8_ = (long)iVar5;
      auVar9._8_4_ = iVar5;
      auVar9._12_4_ = iVar5 >> 0x1f;
      if (mask_type == '\x01') {
        if (0 < h) {
          iVar5 = 0;
          do {
            uVar6 = 0;
            do {
              psVar1 = (short *)(lVar3 + uVar6 * 2);
              psVar2 = (short *)(lVar4 + uVar6 * 2);
              auVar21._0_2_ = *psVar1 - *psVar2;
              auVar21._2_2_ = psVar1[1] - psVar2[1];
              auVar21._4_2_ = psVar1[2] - psVar2[2];
              auVar21._6_2_ = psVar1[3] - psVar2[3];
              auVar21._8_2_ = psVar1[4] - psVar2[4];
              auVar21._10_2_ = psVar1[5] - psVar2[5];
              auVar21._12_2_ = psVar1[6] - psVar2[6];
              auVar21._14_2_ = psVar1[7] - psVar2[7];
              auVar21 = pabsw(auVar21,auVar21);
              auVar21 = psraw(auVar21,auVar9);
              sVar7 = auVar21._0_2_ + 0x26;
              sVar13 = auVar21._2_2_ + 0x26;
              sVar14 = auVar21._4_2_ + 0x26;
              sVar15 = auVar21._6_2_ + 0x26;
              sVar16 = auVar21._8_2_ + 0x26;
              sVar17 = auVar21._10_2_ + 0x26;
              sVar18 = auVar21._12_2_ + 0x26;
              sVar19 = auVar21._14_2_ + 0x26;
              auVar22._2_2_ = (ushort)(-1 < sVar13) * sVar13;
              auVar22._0_2_ = (ushort)(-1 < sVar7) * sVar7;
              auVar22._4_2_ = (ushort)(-1 < sVar14) * sVar14;
              auVar22._6_2_ = (ushort)(-1 < sVar15) * sVar15;
              auVar22._8_2_ = (ushort)(-1 < sVar16) * sVar16;
              auVar22._10_2_ = (ushort)(-1 < sVar17) * sVar17;
              auVar22._12_2_ = (ushort)(-1 < sVar18) * sVar18;
              auVar22._14_2_ = (ushort)(-1 < sVar19) * sVar19;
              auVar21 = psubusw(auVar23,auVar22);
              sVar7 = auVar21._0_2_;
              sVar13 = auVar21._2_2_;
              sVar14 = auVar21._4_2_;
              sVar15 = auVar21._6_2_;
              sVar16 = auVar21._8_2_;
              sVar17 = auVar21._10_2_;
              sVar18 = auVar21._12_2_;
              sVar19 = auVar21._14_2_;
              *(ulong *)(mask + uVar6) =
                   CONCAT17((0 < sVar19) * (sVar19 < 0x100) * auVar21[0xe] - (0xff < sVar19),
                            CONCAT16((0 < sVar18) * (sVar18 < 0x100) * auVar21[0xc] -
                                     (0xff < sVar18),
                                     CONCAT15((0 < sVar17) * (sVar17 < 0x100) * auVar21[10] -
                                              (0xff < sVar17),
                                              CONCAT14((0 < sVar16) * (sVar16 < 0x100) * auVar21[8]
                                                       - (0xff < sVar16),
                                                       CONCAT13((0 < sVar15) * (sVar15 < 0x100) *
                                                                auVar21[6] - (0xff < sVar15),
                                                                CONCAT12((0 < sVar14) *
                                                                         (sVar14 < 0x100) *
                                                                         auVar21[4] -
                                                                         (0xff < sVar14),
                                                                         CONCAT11((0 < sVar13) *
                                                                                  (sVar13 < 0x100) *
                                                                                  auVar21[2] -
                                                                                  (0xff < sVar13),
                                                                                  (0 < sVar7) *
                                                                                  (sVar7 < 0x100) *
                                                                                  auVar21[0] -
                                                                                  (0xff < sVar7)))))
                                             )));
              uVar6 = uVar6 + 8;
            } while (uVar6 < (uint)w);
            mask = mask + (uint)w;
            iVar5 = iVar5 + 1;
            lVar4 = lVar4 + (long)src1_stride * 2;
            lVar3 = lVar3 + (long)src0_stride * 2;
          } while (iVar5 != h);
        }
      }
      else if (0 < h) {
        iVar5 = 0;
        do {
          uVar6 = 0;
          do {
            psVar1 = (short *)(lVar3 + uVar6 * 2);
            psVar2 = (short *)(lVar4 + uVar6 * 2);
            auVar23._0_2_ = *psVar1 - *psVar2;
            auVar23._2_2_ = psVar1[1] - psVar2[1];
            auVar23._4_2_ = psVar1[2] - psVar2[2];
            auVar23._6_2_ = psVar1[3] - psVar2[3];
            auVar23._8_2_ = psVar1[4] - psVar2[4];
            auVar23._10_2_ = psVar1[5] - psVar2[5];
            auVar23._12_2_ = psVar1[6] - psVar2[6];
            auVar23._14_2_ = psVar1[7] - psVar2[7];
            auVar23 = pabsw(auVar23,auVar23);
            auVar23 = psraw(auVar23,auVar9);
            sVar19 = auVar23._0_2_ + 0x26;
            sVar7 = auVar23._2_2_ + 0x26;
            sVar13 = auVar23._4_2_ + 0x26;
            sVar14 = auVar23._6_2_ + 0x26;
            sVar15 = auVar23._8_2_ + 0x26;
            sVar16 = auVar23._10_2_ + 0x26;
            sVar17 = auVar23._12_2_ + 0x26;
            sVar18 = auVar23._14_2_ + 0x26;
            sVar19 = (ushort)(-1 < sVar19) * sVar19;
            sVar7 = (ushort)(-1 < sVar7) * sVar7;
            sVar13 = (ushort)(-1 < sVar13) * sVar13;
            sVar14 = (ushort)(-1 < sVar14) * sVar14;
            sVar15 = (ushort)(-1 < sVar15) * sVar15;
            sVar16 = (ushort)(-1 < sVar16) * sVar16;
            sVar17 = (ushort)(-1 < sVar17) * sVar17;
            sVar18 = (ushort)(-1 < sVar18) * sVar18;
            uVar20 = (ushort)(0x40 < sVar19) * 0x40 | (ushort)(0x40 >= sVar19) * sVar19;
            uVar24 = (ushort)(0x40 < sVar7) * 0x40 | (ushort)(0x40 >= sVar7) * sVar7;
            uVar25 = (ushort)(0x40 < sVar13) * 0x40 | (ushort)(0x40 >= sVar13) * sVar13;
            uVar26 = (ushort)(0x40 < sVar14) * 0x40 | (ushort)(0x40 >= sVar14) * sVar14;
            uVar27 = (ushort)(0x40 < sVar15) * 0x40 | (ushort)(0x40 >= sVar15) * sVar15;
            uVar28 = (ushort)(0x40 < sVar16) * 0x40 | (ushort)(0x40 >= sVar16) * sVar16;
            uVar29 = (ushort)(0x40 < sVar17) * 0x40 | (ushort)(0x40 >= sVar17) * sVar17;
            uVar30 = (ushort)(0x40 < sVar18) * 0x40 | (ushort)(0x40 >= sVar18) * sVar18;
            *(ulong *)(mask + uVar6) =
                 CONCAT17((0 < (short)uVar30) * ((short)uVar30 < 0x100) * (char)uVar30 -
                          (0xff < (short)uVar30),
                          CONCAT16((0 < (short)uVar29) * ((short)uVar29 < 0x100) * (char)uVar29 -
                                   (0xff < (short)uVar29),
                                   CONCAT15((0 < (short)uVar28) * ((short)uVar28 < 0x100) *
                                            (char)uVar28 - (0xff < (short)uVar28),
                                            CONCAT14((0 < (short)uVar27) * ((short)uVar27 < 0x100) *
                                                     (char)uVar27 - (0xff < (short)uVar27),
                                                     CONCAT13((0 < (short)uVar26) *
                                                              ((short)uVar26 < 0x100) * (char)uVar26
                                                              - (0xff < (short)uVar26),
                                                              CONCAT12((0 < (short)uVar25) *
                                                                       ((short)uVar25 < 0x100) *
                                                                       (char)uVar25 -
                                                                       (0xff < (short)uVar25),
                                                                       CONCAT11((0 < (short)uVar24)
                                                                                * ((short)uVar24 <
                                                                                  0x100) *
                                                                                (char)uVar24 -
                                                                                (0xff < (short)
                                                  uVar24),(0 < (short)uVar20) *
                                                          ((short)uVar20 < 0x100) * (char)uVar20 -
                                                          (0xff < (short)uVar20))))))));
            uVar6 = uVar6 + 8;
          } while (uVar6 < (uint)w);
          mask = mask + (uint)w;
          iVar5 = iVar5 + 1;
          lVar4 = lVar4 + (long)src1_stride * 2;
          lVar3 = lVar3 + (long)src0_stride * 2;
        } while (iVar5 != h);
      }
    }
    return;
  }
  av1_build_compound_diffwtd_mask_highbd_c(mask,mask_type,src0,src0_stride,src1,src1_stride,h,w,bd);
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_highbd_ssse3(
    uint8_t *mask, DIFFWTD_MASK_TYPE mask_type, const uint8_t *src0,
    int src0_stride, const uint8_t *src1, int src1_stride, int h, int w,
    int bd) {
  if (w < 8) {
    av1_build_compound_diffwtd_mask_highbd_c(mask, mask_type, src0, src0_stride,
                                             src1, src1_stride, h, w, bd);
  } else {
    assert(bd >= 8);
    assert((w % 8) == 0);
    assert(mask_type == DIFFWTD_38 || mask_type == DIFFWTD_38_INV);
    const __m128i x0 = _mm_setzero_si128();
    const __m128i xAOM_BLEND_A64_MAX_ALPHA =
        _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
    const int mask_base = 38;
    const __m128i xmask_base = _mm_set1_epi16(mask_base);
    const uint16_t *ssrc0 = CONVERT_TO_SHORTPTR(src0);
    const uint16_t *ssrc1 = CONVERT_TO_SHORTPTR(src1);
    if (bd == 8) {
      if (mask_type == DIFFWTD_38_INV) {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 8) {
            __m128i s0 = _mm_loadu_si128((const __m128i *)&ssrc0[j]);
            __m128i s1 = _mm_loadu_si128((const __m128i *)&ssrc1[j]);
            __m128i diff = _mm_srai_epi16(_mm_abs_epi16(_mm_sub_epi16(s0, s1)),
                                          DIFF_FACTOR_LOG2);
            __m128i m = _mm_min_epi16(
                _mm_max_epi16(x0, _mm_add_epi16(diff, xmask_base)),
                xAOM_BLEND_A64_MAX_ALPHA);
            m = _mm_sub_epi16(xAOM_BLEND_A64_MAX_ALPHA, m);
            m = _mm_packus_epi16(m, m);
            _mm_storel_epi64((__m128i *)&mask[j], m);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      } else {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 8) {
            __m128i s0 = _mm_loadu_si128((const __m128i *)&ssrc0[j]);
            __m128i s1 = _mm_loadu_si128((const __m128i *)&ssrc1[j]);
            __m128i diff = _mm_srai_epi16(_mm_abs_epi16(_mm_sub_epi16(s0, s1)),
                                          DIFF_FACTOR_LOG2);
            __m128i m = _mm_min_epi16(
                _mm_max_epi16(x0, _mm_add_epi16(diff, xmask_base)),
                xAOM_BLEND_A64_MAX_ALPHA);
            m = _mm_packus_epi16(m, m);
            _mm_storel_epi64((__m128i *)&mask[j], m);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      }
    } else {
      const __m128i xshift = _mm_set1_epi64x(bd - 8 + DIFF_FACTOR_LOG2);
      if (mask_type == DIFFWTD_38_INV) {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 8) {
            __m128i s0 = _mm_loadu_si128((const __m128i *)&ssrc0[j]);
            __m128i s1 = _mm_loadu_si128((const __m128i *)&ssrc1[j]);
            __m128i diff =
                _mm_sra_epi16(_mm_abs_epi16(_mm_sub_epi16(s0, s1)), xshift);
            __m128i m = _mm_min_epi16(
                _mm_max_epi16(x0, _mm_add_epi16(diff, xmask_base)),
                xAOM_BLEND_A64_MAX_ALPHA);
            m = _mm_sub_epi16(xAOM_BLEND_A64_MAX_ALPHA, m);
            m = _mm_packus_epi16(m, m);
            _mm_storel_epi64((__m128i *)&mask[j], m);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      } else {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 8) {
            __m128i s0 = _mm_loadu_si128((const __m128i *)&ssrc0[j]);
            __m128i s1 = _mm_loadu_si128((const __m128i *)&ssrc1[j]);
            __m128i diff =
                _mm_sra_epi16(_mm_abs_epi16(_mm_sub_epi16(s0, s1)), xshift);
            __m128i m = _mm_min_epi16(
                _mm_max_epi16(x0, _mm_add_epi16(diff, xmask_base)),
                xAOM_BLEND_A64_MAX_ALPHA);
            m = _mm_packus_epi16(m, m);
            _mm_storel_epi64((__m128i *)&mask[j], m);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      }
    }
  }
}